

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

Type * soul::SanityCheckPass::PostResolutionChecks::getDataTypeOfArrayRefLHS
                 (Type *__return_storage_ptr__,ASTObject *o)

{
  bool bVar1;
  EndpointDeclaration *pEVar2;
  EndpointDetails *pEVar3;
  Expression *pEVar4;
  pool_ptr<soul::AST::EndpointDeclaration> e;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  pool_ptr<soul::AST::EndpointDeclaration> local_40;
  pool_ptr<soul::AST::EndpointDeclaration> local_38;
  vector<soul::Type,_std::allocator<soul::Type>_> local_30;
  
  cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>((soul *)&local_40,o);
  if (local_40.object == (EndpointDeclaration *)0x0) {
LAB_0022f309:
    cast<soul::AST::Expression,soul::AST::ASTObject>((soul *)&local_40,o);
    if (local_40.object == (EndpointDeclaration *)0x0) {
      __return_storage_ptr__->category = invalid;
      __return_storage_ptr__->arrayElementCategory = invalid;
      __return_storage_ptr__->isRef = false;
      __return_storage_ptr__->isConstant = false;
      __return_storage_ptr__->primitiveType = invalid;
      __return_storage_ptr__->boundingSize = 0;
      __return_storage_ptr__->arrayElementBoundingSize = 0;
      (__return_storage_ptr__->structure).object = (Structure *)0x0;
      return __return_storage_ptr__;
    }
    pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&local_40);
    (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_38,pEVar4);
    if (local_38.object != (EndpointDeclaration *)0x0) {
      pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_38);
      bVar1 = AST::EndpointDeclaration::isResolved(pEVar2);
      if (bVar1) {
        pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_38);
        pEVar3 = pool_ptr<soul::AST::EndpointDetails>::operator*(&pEVar2->details);
        AST::EndpointDetails::getSampleArrayTypes(&local_30,pEVar3);
        Type::Type(__return_storage_ptr__,
                   local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                   super__Vector_impl_data._M_start);
        goto LAB_0022f389;
      }
    }
    pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&local_40);
    (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[4])(__return_storage_ptr__,pEVar4);
  }
  else {
    pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_40);
    bVar1 = AST::EndpointDeclaration::isResolved(pEVar2);
    if (!bVar1) goto LAB_0022f309;
    pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_40);
    pEVar3 = pool_ptr<soul::AST::EndpointDetails>::operator*(&pEVar2->details);
    AST::EndpointDetails::getSampleArrayTypes(&local_30,pEVar3);
    Type::Type(__return_storage_ptr__,
               local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start);
LAB_0022f389:
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static Type getDataTypeOfArrayRefLHS (AST::ASTObject& o)
        {
            if (auto e = cast<AST::EndpointDeclaration> (o))
                if (e->isResolved())
                    return e->getDetails().getSampleArrayTypes().front();

            if (auto e = cast<AST::Expression> (o))
            {
                if (auto endpoint = e->getAsEndpoint())
                    if (endpoint->isResolved())
                        return endpoint->getDetails().getSampleArrayTypes().front();

                return e->getResultType();
            }

            return {};
        }